

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int coda_time_double_to_parts_utc
              (double datetime,int *year,int *month,int *day,int *hour,int *minute,int *second,
              int *musec)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char *message;
  long in_FS_OFFSET;
  double dVar8;
  int y;
  int m;
  int d;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  double local_50;
  double local_48;
  ulong local_40;
  int *local_38;
  
  if (((second == (int *)0x0 || minute == (int *)0x0) ||
      ((hour == (int *)0x0 || day == (int *)0x0) || (month == (int *)0x0 || year == (int *)0x0))) ||
      musec == (int *)0x0) {
    coda_set_error(-100,"date/time argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x36a);
  }
  else {
    iVar4 = coda_isNaN(datetime);
    if (iVar4 == 0) {
      iVar4 = coda_isInf(datetime);
      if (iVar4 == 0) {
        local_48 = floor(datetime + 5e-07);
        lVar2 = *(long *)(in_FS_OFFSET + -0x108);
        if ((lVar2 == 0) || (uVar7 = *(uint *)(in_FS_OFFSET + -0x100), (int)uVar7 < 1)) {
          __assert_fail("leap_second_table != NULL && num_leap_seconds > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                        ,0x37e,
                        "int coda_time_double_to_parts_utc(double, int *, int *, int *, int *, int *, int *, int *)"
                       );
        }
        uVar5 = 0;
        do {
          pdVar1 = (double *)(lVar2 + uVar5 * 8);
          uVar6 = uVar5;
          if (local_48 < *pdVar1 || local_48 == *pdVar1) break;
          uVar5 = uVar5 + 1;
          uVar6 = (ulong)uVar7;
        } while (uVar7 != uVar5);
        bVar3 = ABS(local_48 - *(double *)(lVar2 + (uVar6 & 0xffffffff) * 8)) < 0.1;
        local_40 = (ulong)bVar3;
        local_50 = (double)(int)((uint)bVar3 + (int)uVar6 + 10);
        local_48 = local_48 - local_50;
        local_38 = second;
        dVar8 = floor(local_48 / 86400.0);
        iVar4 = mjd2000_to_dmy((int)dVar8,&local_64,&local_68,&local_6c);
        if (iVar4 != 0) {
          return -1;
        }
        uVar7 = (uint)((double)(int)dVar8 * -86400.0 + local_48);
        if (uVar7 < 0x15180) {
          local_60 = (ulong)(uVar7 % 0xe10) / 0x3c;
          local_58 = (ulong)((uVar7 % 0xe10) % 0x3c);
          dVar8 = floor((((datetime + 5e-07) - local_50) - local_48) * 1000000.0);
          *year = local_6c;
          *month = local_68;
          *day = local_64;
          *hour = uVar7 / 0xe10;
          *minute = (int)local_60;
          *local_38 = (int)local_58 + (int)local_40;
          *musec = (int)dVar8;
          return 0;
        }
        coda_set_error(-0x68,"dayseconds argument (%d) is not in the range [0,86400)",(ulong)uVar7);
        return -1;
      }
      message = "datetime argument is Infinite";
    }
    else {
      message = "datetime argument is NaN";
    }
    coda_set_error(-0x68,message);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_time_double_to_parts_utc(double datetime, int *year, int *month, int *day, int *hour, int *minute,
                                              int *second, int *musec)
{
    double seconds;
    int d, m, y;
    int h, min, s, us;
    int days, dayseconds;
    int leap_sec;
    int is_leap_sec;

    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (coda_isNaN(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is NaN");
        return -1;
    }
    if (coda_isInf(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is Infinite");
        return -1;
    }

    /* we add 0.5 milliseconds so the floor() becomes a round() that rounds at the millisecond */
    datetime += 5E-7;

    seconds = floor(datetime);

    assert(leap_second_table != NULL && num_leap_seconds > 0);
    leap_sec = 0;
    while (leap_sec < num_leap_seconds && seconds > leap_second_table[leap_sec])
    {
        leap_sec++;
    }
    is_leap_sec = fabs(seconds - leap_second_table[leap_sec]) < 0.1;
    seconds -= 10 + leap_sec + is_leap_sec;
    datetime -= 10 + leap_sec + is_leap_sec;

    days = (int)floor(seconds / 86400.0);

    if (mjd2000_to_dmy(days, &d, &m, &y) != 0)
    {
        return -1;
    }

    dayseconds = (int)(seconds - days * 86400.0);

    if (seconds_to_hms(dayseconds, &h, &min, &s) != 0)
    {
        return -1;
    }

    us = (int)floor((datetime - seconds) * 1E6);

    *year = y;
    *month = m;
    *day = d;
    *hour = h;
    *minute = min;
    *second = s + is_leap_sec;
    *musec = us;

    return 0;
}